

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::(anonymous_namespace)::DatarateTestSVC_BasicRateTargetingSVC3TL1SLDropAllEnh_Test::
~DatarateTestSVC_BasicRateTargetingSVC3TL1SLDropAllEnh_Test
          (DatarateTestSVC_BasicRateTargetingSVC3TL1SLDropAllEnh_Test *this)

{
  DatarateTestSVC_BasicRateTargetingSVC3TL1SLDropAllEnh_Test *unaff_retaddr;
  
  anon_unknown_0::DatarateTestSVC_BasicRateTargetingSVC3TL1SLDropAllEnh_Test::
  ~DatarateTestSVC_BasicRateTargetingSVC3TL1SLDropAllEnh_Test(unaff_retaddr);
  return;
}

Assistant:

TEST_P(DatarateTestSVC, BasicRateTargetingSVC3TL1SLDropAllEnh) {
  BasicRateTargetingSVC3TL1SLDropAllEnhTest();
}